

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::wake(UnixEventPort *this)

{
  int osErrorNumber;
  ssize_t sVar1;
  Fault f;
  uint64_t one;
  
  one = 1;
  do {
    sVar1 = ::write((this->eventFd).fd,&one,8);
    if (-1 < sVar1) {
      if (sVar1 == 8) {
        return;
      }
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x1ad,FAILED,"n < 0 || n == sizeof(one)","");
      kj::_::Debug::Fault::fatal(&f);
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x1ac,osErrorNumber,"n = write(eventFd, &one, sizeof(one))","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void UnixEventPort::wake() const {
  uint64_t one = 1;
  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = write(eventFd, &one, sizeof(one)));
  KJ_ASSERT(n < 0 || n == sizeof(one));
}